

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

void mask_morph(Mat *mask)

{
  undefined4 local_188 [2];
  Mat *local_180;
  undefined8 local_178;
  undefined4 local_170 [2];
  Mat *local_168;
  undefined8 local_160;
  undefined4 local_158 [2];
  Mat *local_150;
  undefined8 local_148;
  undefined8 local_140;
  undefined8 local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined1 local_120 [32];
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  Mat dilateElement;
  Mat erodeElement;
  
  local_e8 = 0x300000003;
  local_f0 = 0xffffffffffffffff;
  cv::getStructuringElement(&erodeElement,0);
  local_f8 = 0x800000008;
  local_100 = 0xffffffffffffffff;
  cv::getStructuringElement(&dilateElement,0);
  local_148 = 0;
  local_160 = 0;
  local_158[0] = 0x1010000;
  local_170[0] = 0x2010000;
  local_178 = 0;
  local_188[0] = 0x1010000;
  local_128 = 0xffffffffffffffff;
  local_180 = &erodeElement;
  local_168 = mask;
  local_150 = mask;
  cv::morphologyDefaultBorderValue();
  cv::erode(local_158,local_170,local_188,&local_128,1,0,local_120);
  local_148 = 0;
  local_160 = 0;
  local_158[0] = 0x1010000;
  local_170[0] = 0x2010000;
  local_178 = 0;
  local_188[0] = 0x1010000;
  local_130 = 0xffffffffffffffff;
  local_180 = &erodeElement;
  local_168 = mask;
  local_150 = mask;
  cv::morphologyDefaultBorderValue();
  cv::erode(local_158,local_170,local_188,&local_130,1,0,local_120);
  local_148 = 0;
  local_160 = 0;
  local_158[0] = 0x1010000;
  local_170[0] = 0x2010000;
  local_178 = 0;
  local_188[0] = 0x1010000;
  local_138 = 0xffffffffffffffff;
  local_180 = &dilateElement;
  local_168 = mask;
  local_150 = mask;
  cv::morphologyDefaultBorderValue();
  cv::dilate(local_158,local_170,local_188,&local_138,1,0,local_120);
  local_148 = 0;
  local_160 = 0;
  local_158[0] = 0x1010000;
  local_170[0] = 0x2010000;
  local_178 = 0;
  local_188[0] = 0x1010000;
  local_140 = 0xffffffffffffffff;
  local_180 = &dilateElement;
  local_168 = mask;
  local_150 = mask;
  cv::morphologyDefaultBorderValue();
  cv::dilate(local_158,local_170,local_188,&local_140,1,0,local_120);
  cv::Mat::~Mat(&dilateElement);
  cv::Mat::~Mat(&erodeElement);
  return;
}

Assistant:

void mask_morph(Mat &mask) {
    Mat erodeElement = getStructuringElement(MORPH_RECT, Size(3, 3));
    Mat dilateElement = getStructuringElement(MORPH_RECT, Size(8, 8));
    erode(mask, mask, erodeElement);
    erode(mask, mask, erodeElement);
    dilate(mask, mask, dilateElement);
    dilate(mask, mask, dilateElement);
}